

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib502.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  uint *puVar6;
  char *pcVar7;
  FILE *pFVar8;
  timeval tVar9;
  undefined8 uStack_1e0;
  int maxfd;
  int running;
  long local_1c8;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  
  tv_test_start = tutil_tvnow();
  uVar1 = curl_global_init(3);
  pFVar8 = _stderr;
  if (uVar1 != 0) {
    uVar5 = curl_easy_strerror(uVar1);
    fprintf(pFVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib502.c"
            ,0x2b,(ulong)uVar1,uVar5);
    goto LAB_00102668;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib502.c"
            ,0x2d);
    uVar1 = 0x7c;
LAB_00102502:
    lVar4 = 0;
  }
  else {
    uVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    pFVar8 = _stderr;
    if (uVar1 == 0) {
      lVar4 = curl_multi_init();
      if (lVar4 == 0) {
        fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib502.c"
                ,0x31);
        uVar1 = 0x7b;
        goto LAB_00102502;
      }
      uVar1 = curl_multi_add_handle(lVar4,lVar3);
      pFVar8 = _stderr;
      if (uVar1 != 0) {
        uVar5 = curl_multi_strerror(uVar1);
        pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_1e0 = 0x33;
        goto LAB_0010252b;
      }
      local_1c8 = lVar3;
      do {
        maxfd = -99;
        timeout.tv_sec = 0;
        timeout.tv_usec = 100000;
        uVar1 = curl_multi_perform(lVar4,&running);
        pFVar8 = _stderr;
        if (uVar1 != 0) {
          uVar5 = curl_multi_strerror(uVar1);
          pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uStack_1e0 = 0x3d;
LAB_001025ce:
          fprintf(pFVar8,pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib502.c"
                  ,uStack_1e0,(ulong)uVar1,uVar5);
          lVar3 = local_1c8;
          goto LAB_00102648;
        }
        if (running < 0) {
          pcVar7 = 
          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
          uStack_1e0 = 0x3d;
LAB_001025fb:
          fprintf(_stderr,pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib502.c"
                  ,uStack_1e0);
          uVar1 = 0x7a;
          lVar3 = local_1c8;
          goto LAB_00102648;
        }
        tVar9 = tutil_tvnow();
        lVar3 = tutil_tvdiff(tVar9,tv_test_start);
        if (60000 < lVar3) {
          uStack_1e0 = 0x3f;
          goto LAB_0010259c;
        }
        if (running == 0) {
          uVar1 = 0;
          lVar3 = local_1c8;
          goto LAB_00102648;
        }
        for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
          fdread.__fds_bits[lVar3] = 0;
        }
        for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
          fdwrite.__fds_bits[lVar3] = 0;
        }
        for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
          fdexcep.__fds_bits[lVar3] = 0;
        }
        uVar1 = curl_multi_fdset(lVar4,&fdread,&fdwrite,&fdexcep,&maxfd);
        pFVar8 = _stderr;
        if (uVar1 != 0) {
          uVar5 = curl_multi_strerror(uVar1);
          pcVar7 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
          uStack_1e0 = 0x48;
          goto LAB_001025ce;
        }
        if (maxfd < -1) {
          pcVar7 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
          uStack_1e0 = 0x48;
          goto LAB_001025fb;
        }
        iVar2 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&timeout);
        if (iVar2 == -1) {
          puVar6 = (uint *)__errno_location();
          pFVar8 = _stderr;
          uVar1 = *puVar6;
          pcVar7 = strerror(uVar1);
          fprintf(pFVar8,"%s:%d select() failed, with errno %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib502.c"
                  ,0x4c,(ulong)uVar1,pcVar7);
          uVar1 = 0x79;
          lVar3 = local_1c8;
          goto LAB_00102648;
        }
        tVar9 = tutil_tvnow();
        lVar3 = tutil_tvdiff(tVar9,tv_test_start);
      } while (lVar3 < 0xea61);
      uStack_1e0 = 0x4e;
LAB_0010259c:
      fprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib502.c"
              ,uStack_1e0);
      uVar1 = 0x7d;
      lVar3 = local_1c8;
    }
    else {
      uVar5 = curl_easy_strerror(uVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uStack_1e0 = 0x2f;
LAB_0010252b:
      fprintf(pFVar8,pcVar7,
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib502.c"
              ,uStack_1e0,(ulong)uVar1,uVar5);
    }
  }
LAB_00102648:
  curl_multi_remove_handle(lVar4,lVar3);
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_00102668:
  return uVar1;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_URL, URL);

  multi_init(m);

  multi_add_handle(m, c);

  for(;;) {
    struct timeval timeout;
    fd_set fdread, fdwrite, fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(m, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}